

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conc_heter_queue.h
# Opt level: O0

reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> * __thiscall
density::conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
start_reentrant_emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
          (reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>
           *__return_storage_ptr__,
          conc_heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *this,
          TestObject<256UL,_128UL> *i_construction_params)

{
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_88;
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> local_58;
  undefined1 local_40 [8];
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> put_transaction;
  lock_guard<std::mutex> lock;
  TestObject<256UL,_128UL> *i_construction_params_local;
  conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
  *this_local;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&put_transaction.m_put_data.m_user_storage,(mutex_type *)this
            );
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  start_reentrant_emplace<density_tests::TestObject<256ul,128ul>,density_tests::TestObject<256ul,128ul>>
            (&local_58,
             (heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>> *)
             (this + 0x28),i_construction_params);
  heter_queue<density::runtime_type<>,density::basic_default_allocator<65536ul>>::
  reentrant_put_transaction<density_tests::TestObject<256ul,128ul>>::
  reentrant_put_transaction<density_tests::TestObject<256ul,128ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<256ul,128ul>> *)local_40,&local_58
            );
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_58);
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::reentrant_put_transaction
            (&local_88,0,
             (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
              *)this,(reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> *)local_40
            );
  reentrant_put_transaction<density_tests::TestObject<256ul,128ul>>::
  reentrant_put_transaction<density_tests::TestObject<256ul,128ul>,void>
            ((reentrant_put_transaction<density_tests::TestObject<256ul,128ul>> *)
             __return_storage_ptr__,&local_88);
  conc_heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            (&local_88);
  heter_queue<density::runtime_type<>,_density::basic_default_allocator<65536UL>_>::
  reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_>::~reentrant_put_transaction
            ((reentrant_put_transaction<density_tests::TestObject<256UL,_128UL>_> *)local_40);
  std::lock_guard<std::mutex>::~lock_guard
            ((lock_guard<std::mutex> *)&put_transaction.m_put_data.m_user_storage);
  return __return_storage_ptr__;
}

Assistant:

reentrant_put_transaction<ELEMENT_TYPE>
          start_reentrant_emplace(CONSTRUCTION_PARAMS &&... i_construction_params)
        {
            std::lock_guard<std::mutex> lock(m_mutex);
            auto put_transaction = m_queue.template start_reentrant_emplace<ELEMENT_TYPE>(
              std::forward<CONSTRUCTION_PARAMS>(i_construction_params)...);
            return reentrant_put_transaction<ELEMENT_TYPE>(
              PrivateType(), this, std::move(put_transaction));
        }